

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::doReplace
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  char16_t **ppcVar1;
  int32_t *piVar2;
  ushort uVar3;
  UBool UVar4;
  int iVar5;
  UnicodeString *pUVar6;
  UnicodeString *__dest;
  UChar *s;
  uint uVar7;
  int newCapacity;
  uint count;
  int32_t *bufferToDelete;
  UChar oldStackBuffer [27];
  uint local_90;
  int local_8c;
  UnicodeString *local_88;
  int32_t *local_80;
  UnicodeString local_78;
  
  uVar3 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar3 & 0x11) != 0) {
    return this;
  }
  if ((short)uVar3 < 0) {
    count = (this->fUnion).fFields.fLength;
  }
  else {
    count = (int)(short)uVar3 >> 5;
  }
  local_90 = start;
  local_8c = length;
  if (srcLength == 0 && (uVar3 & 8) != 0) {
    if (start == 0) {
      pinIndex(this,&local_8c);
      ppcVar1 = &(this->fUnion).fFields.fArray;
      *ppcVar1 = *ppcVar1 + local_8c;
      piVar2 = &(this->fUnion).fFields.fCapacity;
      *piVar2 = *piVar2 - local_8c;
      setLength(this,count - local_8c);
      return this;
    }
    pinIndex(this,(int32_t *)&local_90);
    if ((int)(count - local_90) <= local_8c) {
      setLength(this,local_90);
      (this->fUnion).fFields.fCapacity = local_90;
      return this;
    }
  }
  if (local_90 == count) {
    pUVar6 = doAppend(this,srcChars,srcStart,srcLength);
    return pUVar6;
  }
  if (srcChars == (UChar *)0x0) {
    srcLength = 0;
    s = (UChar *)0x0;
  }
  else {
    s = srcChars + srcStart;
    if (srcLength < 0) {
      srcLength = u_strlen_63(s);
    }
  }
  pinIndices(this,(int32_t *)&local_90,&local_8c);
  uVar7 = count - local_8c;
  if ((int)(uVar7 ^ 0x7fffffff) < srcLength) {
    setToBogus(this);
    return this;
  }
  local_88 = (UnicodeString *)(this->fUnion).fStackFields.fBuffer;
  pUVar6 = local_88;
  if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
    pUVar6 = (UnicodeString *)(this->fUnion).fFields.fArray;
  }
  UVar4 = isBufferWritable(this);
  if (((UVar4 != '\0') && (pUVar6 < (UnicodeString *)(s + srcLength))) &&
     (s < (UChar *)((long)&(pUVar6->super_Replaceable).super_UObject._vptr_UObject +
                   (long)(int)count * 2))) {
    UnicodeString(&local_78,s,srcLength);
    if ((local_78.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      if ((local_78.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_78.fUnion.fFields.fArray = local_78.fUnion.fStackFields.fBuffer;
      }
      this = doReplace(this,local_90,local_8c,local_78.fUnion.fFields.fArray,0,srcLength);
    }
    else {
      setToBogus(this);
    }
    ~UnicodeString(&local_78);
    return this;
  }
  newCapacity = uVar7 + srcLength;
  if (((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) !=
       (undefined1  [56])0x0) && (0x1b < newCapacity)) {
    u_memcpy_63((UChar *)&local_78,(UChar *)pUVar6,count);
    pUVar6 = &local_78;
  }
  local_80 = (int32_t *)0x0;
  iVar5 = (newCapacity >> 2) + 0x80 + newCapacity;
  if (0x7ffffff5 - newCapacity < (newCapacity >> 2) + 0x80) {
    iVar5 = 0x7ffffff5;
  }
  UVar4 = cloneArrayIfNeeded(this,newCapacity,iVar5,'\0',&local_80,'\0');
  if (UVar4 == '\0') {
    return this;
  }
  __dest = local_88;
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
      (undefined1  [56])0x0) {
    __dest = (UnicodeString *)(this->fUnion).fFields.fArray;
  }
  if (__dest == pUVar6) {
    if (local_8c == srcLength) goto LAB_002dc57b;
  }
  else if (0 < (int)local_90) {
    local_88 = __dest;
    memmove(__dest,pUVar6,(ulong)local_90 * 2);
    __dest = local_88;
  }
  iVar5 = local_8c + local_90;
  if (count - iVar5 != 0 && iVar5 <= (int)count) {
    local_88 = __dest;
    memmove((void *)((long)&(__dest->super_Replaceable).super_UObject._vptr_UObject +
                    (long)(int)(local_90 + srcLength) * 2),
            (void *)((long)&(pUVar6->super_Replaceable).super_UObject._vptr_UObject +
                    (long)iVar5 * 2),(ulong)((count - iVar5) * 2));
    __dest = local_88;
  }
LAB_002dc57b:
  if (0 < srcLength) {
    memmove((void *)((long)&(__dest->super_Replaceable).super_UObject._vptr_UObject +
                    (long)(int)local_90 * 2),s,(ulong)(uint)(srcLength * 2));
  }
  setLength(this,newCapacity);
  if (local_80 != (int32_t *)0x0) {
    uprv_free_63(local_80);
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doReplace(int32_t start,
             int32_t length,
             const UChar *srcChars,
             int32_t srcStart,
             int32_t srcLength)
{
  if(!isWritable()) {
    return *this;
  }

  int32_t oldLength = this->length();

  // optimize (read-only alias).remove(0, start) and .remove(start, end)
  if((fUnion.fFields.fLengthAndFlags&kBufferIsReadonly) && srcLength == 0) {
    if(start == 0) {
      // remove prefix by adjusting the array pointer
      pinIndex(length);
      fUnion.fFields.fArray += length;
      fUnion.fFields.fCapacity -= length;
      setLength(oldLength - length);
      return *this;
    } else {
      pinIndex(start);
      if(length >= (oldLength - start)) {
        // remove suffix by reducing the length (like truncate())
        setLength(start);
        fUnion.fFields.fCapacity = start;  // not NUL-terminated any more
        return *this;
      }
    }
  }

  if(start == oldLength) {
    return doAppend(srcChars, srcStart, srcLength);
  }

  if(srcChars == 0) {
    srcLength = 0;
  } else {
    // Perform all remaining operations relative to srcChars + srcStart.
    // From this point forward, do not use srcStart.
    srcChars += srcStart;
    if (srcLength < 0) {
      // get the srcLength if necessary
      srcLength = u_strlen(srcChars);
    }
  }

  // pin the indices to legal values
  pinIndices(start, length);

  // Calculate the size of the string after the replace.
  // Avoid int32_t overflow.
  int32_t newLength = oldLength - length;
  if(srcLength > (INT32_MAX - newLength)) {
    setToBogus();
    return *this;
  }
  newLength += srcLength;

  // Check for insertion into ourself
  const UChar *oldArray = getArrayStart();
  if (isBufferWritable() &&
      oldArray < srcChars + srcLength &&
      srcChars < oldArray + oldLength) {
    // Copy into a new UnicodeString and start over
    UnicodeString copy(srcChars, srcLength);
    if (copy.isBogus()) {
      setToBogus();
      return *this;
    }
    return doReplace(start, length, copy.getArrayStart(), 0, srcLength);
  }

  // cloneArrayIfNeeded(doCopyArray=FALSE) may change fArray but will not copy the current contents;
  // therefore we need to keep the current fArray
  UChar oldStackBuffer[US_STACKBUF_SIZE];
  if((fUnion.fFields.fLengthAndFlags&kUsingStackBuffer) && (newLength > US_STACKBUF_SIZE)) {
    // copy the stack buffer contents because it will be overwritten with
    // fUnion.fFields values
    u_memcpy(oldStackBuffer, oldArray, oldLength);
    oldArray = oldStackBuffer;
  }

  // clone our array and allocate a bigger array if needed
  int32_t *bufferToDelete = 0;
  if(!cloneArrayIfNeeded(newLength, getGrowCapacity(newLength),
                         FALSE, &bufferToDelete)
  ) {
    return *this;
  }

  // now do the replace

  UChar *newArray = getArrayStart();
  if(newArray != oldArray) {
    // if fArray changed, then we need to copy everything except what will change
    us_arrayCopy(oldArray, 0, newArray, 0, start);
    us_arrayCopy(oldArray, start + length,
                 newArray, start + srcLength,
                 oldLength - (start + length));
  } else if(length != srcLength) {
    // fArray did not change; copy only the portion that isn't changing, leaving a hole
    us_arrayCopy(oldArray, start + length,
                 newArray, start + srcLength,
                 oldLength - (start + length));
  }

  // now fill in the hole with the new string
  us_arrayCopy(srcChars, 0, newArray, start, srcLength);

  setLength(newLength);

  // delayed delete in case srcChars == fArray when we started, and
  // to keep oldArray alive for the above operations
  if (bufferToDelete) {
    uprv_free(bufferToDelete);
  }

  return *this;
}